

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O0

bool __thiscall Regex::parse(Regex *this,string *string)

{
  undefined1 local_58 [7];
  bool res;
  ParseData data;
  Element *cur_node;
  string *string_local;
  Regex *this_local;
  
  if ((this->mState == STATE_PARSED) || (this->mState == STATE_PREPARED)) {
    data._40_8_ = &this->mRoot;
    ParseData::ParseData((ParseData *)local_58,string);
    this_local._7_1_ = processSubTree(this,(Element *)data._40_8_,(ParseData *)local_58);
    if (this_local._7_1_) {
      this->mState = STATE_PARSED;
    }
    ParseData::~ParseData((ParseData *)local_58);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool	Regex::parse( const JHSTD::string &string )
{	
	if ( mState != Regex::STATE_PARSED && mState != Regex::STATE_PREPARED )
		return JetHead::kNotInitialized;
	
	Element *cur_node = &mRoot;
	ParseData data( string );
	
	bool res = processSubTree( cur_node, &data );

	if ( res )
		mState = Regex::STATE_PARSED;

	return res;
}